

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

WasmNode * __thiscall
Wasm::WasmBinaryReader::ReadInitExpr
          (WasmNode *__return_storage_ptr__,WasmBinaryReader *this,bool isOffset)

{
  byte *pbVar1;
  byte *pbVar2;
  code *pcVar3;
  WasmBlock WVar4;
  uint32 *puVar5;
  undefined8 uVar6;
  undefined6 uVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  WasmGlobal *pWVar11;
  uint uVar12;
  char16_t *msg;
  WebAssemblyModule *pWVar13;
  
  if (this->m_readerState != READER_STATE_MODULE) {
    msg = L"Wasm reader in an invalid state to read init_expr";
    goto LAB_00d67a47;
  }
  (this->m_funcState).count = 0;
  pbVar1 = this->m_pc;
  pbVar2 = (this->m_currentSection).end;
  uVar12 = (int)pbVar2 - (int)pbVar1;
  (this->m_funcState).size = uVar12;
  if (pbVar1 + uVar12 != pbVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                       ,0x527,"(m_pc + m_funcState.size == m_currentSection.end)",
                       "m_pc + m_funcState.size == m_currentSection.end");
    if (!bVar8) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  pWVar13 = (WebAssemblyModule *)this;
  (*(this->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
  uVar7 = *(undefined6 *)&(this->super_WasmReaderBase).m_currentNode.field_0x2;
  WVar4 = (this->super_WasmReaderBase).m_currentNode.field_1.block;
  puVar5 = (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
  uVar6 = *(undefined8 *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + 0x10);
  __return_storage_ptr__->op = (this->super_WasmReaderBase).m_currentNode.op;
  *(undefined6 *)&__return_storage_ptr__->field_0x2 = uVar7;
  (__return_storage_ptr__->field_1).block = WVar4;
  (__return_storage_ptr__->field_1).brTable.targetTable = puVar5;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = uVar6;
  if (3 < __return_storage_ptr__->op - 0x41) {
    if (__return_storage_ptr__->op != wbGetGlobal) {
      msg = L"Invalid initexpr opcode";
      __return_storage_ptr__ = (WasmNode *)pWVar13;
      goto LAB_00d67a47;
    }
    pWVar13 = this->m_module;
    pWVar11 = Js::WebAssemblyModule::GetGlobal
                        (pWVar13,(__return_storage_ptr__->field_1).brTable.numTargets);
    if (pWVar11->m_rType != ImportedReference) {
      msg = L"initializer expression can only use imported globals";
      __return_storage_ptr__ = (WasmNode *)pWVar13;
      goto LAB_00d67a47;
    }
    if (pWVar11->m_isMutable == true) {
      msg = L"initializer expression cannot reference a mutable global";
      __return_storage_ptr__ = (WasmNode *)pWVar13;
      goto LAB_00d67a47;
    }
  }
  pWVar13 = (WebAssemblyModule *)this;
  iVar9 = (*(this->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
  if ((short)iVar9 == 0xb) {
    if (isOffset) {
      Js::WebAssemblyModule::ValidateInitExportForOffset(this->m_module,__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  msg = L"Missing end opcode after init expr";
  __return_storage_ptr__ = (WasmNode *)pWVar13;
LAB_00d67a47:
  ThrowDecodingError((WasmBinaryReader *)__return_storage_ptr__,msg);
}

Assistant:

WasmNode WasmBinaryReader::ReadInitExpr(bool isOffset)
{
    if (m_readerState != READER_STATE_MODULE)
    {
        ThrowDecodingError(_u("Wasm reader in an invalid state to read init_expr"));
    }

    m_funcState.count = 0;
    m_funcState.size = (uint32)(m_currentSection.end - m_pc);
#if TARGET_64
    Assert(m_pc + m_funcState.size == m_currentSection.end);
#endif
    ReadExpr();
    WasmNode node = m_currentNode;
    switch (node.op)
    {
    case wbI32Const:
    case wbF32Const:
    case wbI64Const:
    case wbF64Const:
        break;
    case wbGetGlobal:
    {
        uint32 globalIndex = node.var.num;
        WasmGlobal* global = m_module->GetGlobal(globalIndex);
        if (global->GetReferenceType() != GlobalReferenceTypes::ImportedReference)
        {
            ThrowDecodingError(_u("initializer expression can only use imported globals"));
        }
        if (global->IsMutable())
        {
            ThrowDecodingError(_u("initializer expression cannot reference a mutable global"));
        }
        break;
    }
    default:
        ThrowDecodingError(_u("Invalid initexpr opcode"));
    }

    if (ReadExpr() != wbEnd)
    {
        ThrowDecodingError(_u("Missing end opcode after init expr"));
    }
    if (isOffset)
    {
        m_module->ValidateInitExportForOffset(node);
    }
    return node;
}